

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

void __thiscall
DatabaseSnapshot::reindex_dataset
          (DatabaseSnapshot *this,Task *task,vector<IndexType,_std::allocator<IndexType>_> *types,
          string *dataset_name)

{
  atomic_uint64_t *paVar1;
  OnDiskDataset *this_00;
  Task *pTVar2;
  OnDiskDataset *pOVar3;
  string *obj_name;
  _Base_ptr p_Var4;
  runtime_error *this_01;
  allocator<char> local_26d;
  DbChangeType local_26c;
  Task *task_local;
  OnDiskDataset *local_260;
  string local_258;
  pointer local_238;
  pointer local_230;
  Task *local_228;
  string local_220;
  _Any_data local_200;
  code *local_1f0;
  code *local_1e8;
  DBChange local_1e0;
  DBChange local_198;
  DBChange local_150;
  Indexer indexer;
  
  task_local = task;
  pOVar3 = find_dataset(this,dataset_name);
  if (pOVar3 != (OnDiskDataset *)0x0) {
    Indexer::Indexer(&indexer,this,types);
    local_200._8_8_ = &task_local;
    LOCK();
    (task_local->spec_->work_estimated_).super___atomic_base<unsigned_long>._M_i =
         (pOVar3->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
         super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
         super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count + 1;
    UNLOCK();
    local_1e8 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:176:31)>
                ::_M_invoke;
    local_1f0 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:176:31)>
                ::_M_manager;
    local_200._M_unused._M_object = &indexer;
    OnDiskFileIndex::for_each_filename
              ((OnDiskFileIndex *)&pOVar3->files_index,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_200);
    std::_Function_base::~_Function_base((_Function_base *)&local_200);
    Indexer::finalize((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                      &local_258,&indexer);
    local_238 = (pointer)local_258._M_string_length;
    local_260 = pOVar3;
    while (local_258._M_dataplus._M_p != local_238) {
      this_00 = *(OnDiskDataset **)local_258._M_dataplus._M_p;
      local_228 = task_local;
      local_26c = Insert;
      local_230 = local_258._M_dataplus._M_p;
      obj_name = OnDiskDataset::get_name_abi_cxx11_(this_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_26d);
      DBChange::DBChange(&local_150,&local_26c,obj_name,&local_220);
      std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                (&local_228->changes_,&local_150);
      DBChange::~DBChange(&local_150);
      std::__cxx11::string::~string((string *)&local_220);
      for (p_Var4 = (local_260->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pTVar2 = task_local,
          (_Rb_tree_header *)p_Var4 != &(pOVar3->taints)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        local_26c = ToggleTaint;
        OnDiskDataset::get_id_abi_cxx11_(&local_220,this_00);
        DBChange::DBChange(&local_198,&local_26c,&local_220,(string *)(p_Var4 + 1));
        std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                  (&pTVar2->changes_,&local_198);
        DBChange::~DBChange(&local_198);
        std::__cxx11::string::~string((string *)&local_220);
      }
      local_258._M_dataplus._M_p = local_230 + 8;
    }
    std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
              ((_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               &local_258);
    pTVar2 = task_local;
    local_26c = Drop;
    OnDiskDataset::get_id_abi_cxx11_(&local_220,local_260);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"",&local_26d);
    DBChange::DBChange(&local_1e0,&local_26c,&local_220,&local_258);
    std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
              (&pTVar2->changes_,&local_1e0);
    DBChange::~DBChange(&local_1e0);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_220);
    LOCK();
    paVar1 = &task_local->spec_->work_done_;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    Indexer::~Indexer(&indexer);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"source dataset was not found");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DatabaseSnapshot::reindex_dataset(Task *task,
                                       const std::vector<IndexType> &types,
                                       const std::string &dataset_name) const {
    const OnDiskDataset *source = find_dataset(dataset_name);

    if (source == nullptr) {
        throw std::runtime_error("source dataset was not found");
    }

    Indexer indexer(this, types);

    task->spec().estimate_work(source->get_file_count() + 1);

    source->for_each_filename([&indexer, &task](const std::string &target) {
        spdlog::debug("Reindexing {}", target);
        indexer.index(target);
        task->spec().add_progress(1);
    });

    for (const auto *ds : indexer.finalize()) {
        task->change(DBChange(DbChangeType::Insert, ds->get_name()));
        for (const auto &taint : source->get_taints()) {
            task->change(
                DBChange(DbChangeType::ToggleTaint, ds->get_id(), taint));
        }
    }

    task->change(DBChange(DbChangeType::Drop, source->get_id()));
    task->spec().add_progress(1);
}